

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_hdu_clear(NGP_HDU *ngph)

{
  int local_1c;
  int i;
  NGP_HDU *ngph_local;
  
  if (ngph == (NGP_HDU *)0x0) {
    ngph_local._4_4_ = 0x16a;
  }
  else {
    for (local_1c = 0; local_1c < ngph->tokcnt; local_1c = local_1c + 1) {
      if ((ngph->tok[local_1c].type == 2) && (ngph->tok[local_1c].value.s != (char *)0x0)) {
        free(ngph->tok[local_1c].value.s);
        ngph->tok[local_1c].value.s = (char *)0x0;
      }
    }
    if (ngph->tok != (NGP_TOKEN *)0x0) {
      free(ngph->tok);
    }
    ngph->tok = (NGP_TOKEN *)0x0;
    ngph->tokcnt = 0;
    ngph_local._4_4_ = 0;
  }
  return ngph_local._4_4_;
}

Assistant:

int	ngp_hdu_clear(NGP_HDU *ngph)
 { int i;

   if (NULL == ngph) return(NGP_NUL_PTR);

   for (i=0; i<ngph->tokcnt; i++)
    { if (NGP_TTYPE_STRING == ngph->tok[i].type)
        if (NULL != ngph->tok[i].value.s)
          { ngp_free(ngph->tok[i].value.s);
            ngph->tok[i].value.s = NULL;
          }
    }

   if (NULL != ngph->tok) ngp_free(ngph->tok);

   ngph->tok = NULL;
   ngph->tokcnt = 0;

   return(NGP_OK);
 }